

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ManAppendXorReal(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pObj;
  ulong uVar5;
  ulong uVar6;
  
  pObj = Gia_ManAppendObj(p);
  iVar1 = Abc_Lit2Var(iLit0);
  if (p->nObjs <= iVar1) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x2d5,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
  }
  iVar1 = Abc_Lit2Var(iLit1);
  if (iVar1 < p->nObjs) {
    iVar1 = Abc_Lit2Var(iLit0);
    iVar2 = Abc_Lit2Var(iLit1);
    if (iVar1 != iVar2) {
      uVar3 = Abc_Lit2Var(iLit0);
      uVar4 = Abc_Lit2Var(iLit1);
      iVar1 = Gia_ObjId(p,pObj);
      iVar2 = Abc_Lit2Var(iLit0);
      uVar5 = (ulong)(iVar1 - iVar2 & 0x1fffffff);
      if (uVar4 < uVar3) {
        *(ulong *)pObj = *(ulong *)pObj & 0xffffffffe0000000 | uVar5;
        iVar1 = Abc_LitIsCompl(iLit0);
        *(ulong *)pObj = *(ulong *)pObj & 0xffffffffdfffffff | (ulong)(uint)(iVar1 << 0x1d);
        iVar1 = Gia_ObjId(p,pObj);
        iVar2 = Abc_Lit2Var(iLit1);
        *(ulong *)pObj =
             *(ulong *)pObj & 0xe0000000ffffffff | (ulong)(iVar1 - iVar2 & 0x1fffffff) << 0x20;
        uVar3 = Abc_LitIsCompl(iLit1);
        uVar5 = (ulong)uVar3 << 0x3d;
        uVar6 = 0xdfffffffffffffff;
      }
      else {
        *(ulong *)pObj = *(ulong *)pObj & 0xe0000000ffffffff | uVar5 << 0x20;
        uVar3 = Abc_LitIsCompl(iLit0);
        *(ulong *)pObj = *(ulong *)pObj & 0xdfffffffffffffff | (ulong)uVar3 << 0x3d;
        iVar1 = Gia_ObjId(p,pObj);
        iVar2 = Abc_Lit2Var(iLit1);
        *(ulong *)pObj = *(ulong *)pObj & 0xffffffffe0000000 | (ulong)(iVar1 - iVar2 & 0x1fffffff);
        iVar1 = Abc_LitIsCompl(iLit1);
        uVar5 = (ulong)(uint)(iVar1 << 0x1d);
        uVar6 = 0xffffffffdfffffff;
      }
      *(ulong *)pObj = uVar6 & *(ulong *)pObj | uVar5;
      p->nXors = p->nXors + 1;
      iVar1 = Gia_ObjId(p,pObj);
      return iVar1 * 2;
    }
    __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x2d7,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
  }
  __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x2d6,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
}

Assistant:

static inline int Gia_ManAppendXorReal( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    assert( iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p) );
    assert( iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p) );
    assert( Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1) );
    //assert( !Abc_LitIsCompl(iLit0) );
    //assert( !Abc_LitIsCompl(iLit1) );
    if ( Abc_Lit2Var(iLit0) > Abc_Lit2Var(iLit1) )
    {
        pObj->iDiff0  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0));
        pObj->fCompl0 = (unsigned)(Abc_LitIsCompl(iLit0));
        pObj->iDiff1  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1));
        pObj->fCompl1 = (unsigned)(Abc_LitIsCompl(iLit1));
    }
    else
    {
        pObj->iDiff1  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0));
        pObj->fCompl1 = (unsigned)(Abc_LitIsCompl(iLit0));
        pObj->iDiff0  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1));
        pObj->fCompl0 = (unsigned)(Abc_LitIsCompl(iLit1));
    }
    p->nXors++;
    return Gia_ObjId( p, pObj ) << 1;
}